

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool gpt_params_parse(int argc,char **argv,gpt_params *params)

{
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  istreambuf_iterator<char,_std::char_traits<char>_> __last;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  byte bVar10;
  int iVar11;
  char *pcVar12;
  undefined8 uVar13;
  int *in_RDX;
  long in_RSI;
  int in_EDI;
  float fVar14;
  ifstream file;
  string arg;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa98;
  gpt_params *in_stack_fffffffffffffaa0;
  FILE *__stream;
  undefined6 in_stack_fffffffffffffaa8;
  undefined1 in_stack_fffffffffffffaae;
  undefined1 in_stack_fffffffffffffaaf;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffab0;
  undefined1 in_stack_fffffffffffffad0;
  undefined1 in_stack_fffffffffffffad1;
  undefined1 in_stack_fffffffffffffad2;
  undefined1 in_stack_fffffffffffffad3;
  undefined1 in_stack_fffffffffffffad4;
  undefined1 in_stack_fffffffffffffad5;
  undefined1 in_stack_fffffffffffffad6;
  undefined1 in_stack_fffffffffffffad7;
  int in_stack_fffffffffffffad8;
  undefined1 in_stack_fffffffffffffadc;
  undefined1 in_stack_fffffffffffffadd;
  undefined1 in_stack_fffffffffffffade;
  undefined1 in_stack_fffffffffffffadf;
  int in_stack_fffffffffffffae0;
  undefined2 in_stack_fffffffffffffae4;
  undefined1 in_stack_fffffffffffffae6;
  undefined1 in_stack_fffffffffffffae7;
  int in_stack_fffffffffffffae8;
  undefined2 in_stack_fffffffffffffaec;
  undefined1 in_stack_fffffffffffffaee;
  undefined1 in_stack_fffffffffffffaef;
  int in_stack_fffffffffffffaf4;
  int in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffafc;
  float in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  int in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  int in_stack_fffffffffffffb18;
  undefined2 in_stack_fffffffffffffb1c;
  int in_stack_fffffffffffffb20;
  int in_stack_fffffffffffffb28;
  undefined2 in_stack_fffffffffffffb2c;
  string local_4b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_490;
  int local_464;
  long local_460 [65];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [36];
  int local_1c;
  int *local_18;
  long local_10;
  int local_4;
  
  local_1c = 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  do {
    if (local_4 <= local_1c) {
      return true;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffae7,
                        CONCAT16(in_stack_fffffffffffffae6,
                                 CONCAT24(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0))),
               (char *)CONCAT17(in_stack_fffffffffffffadf,
                                CONCAT16(in_stack_fffffffffffffade,
                                         CONCAT15(in_stack_fffffffffffffadd,
                                                  CONCAT14(in_stack_fffffffffffffadc,
                                                           in_stack_fffffffffffffad8)))),
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffffad7,
                        CONCAT16(in_stack_fffffffffffffad6,
                                 CONCAT15(in_stack_fffffffffffffad5,
                                          CONCAT14(in_stack_fffffffffffffad4,
                                                   CONCAT13(in_stack_fffffffffffffad3,
                                                            CONCAT12(in_stack_fffffffffffffad2,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffad1,
                                                  in_stack_fffffffffffffad0))))))));
    std::allocator<char>::~allocator(&local_41);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98), bVar1
       )) {
      get_next_arg((int *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                   in_stack_fffffffffffffaf4,
                   (char **)CONCAT17(in_stack_fffffffffffffaef,
                                     CONCAT16(in_stack_fffffffffffffaee,
                                              CONCAT24(in_stack_fffffffffffffaec,
                                                       in_stack_fffffffffffffae8))),
                   (string *)
                   CONCAT17(in_stack_fffffffffffffae7,
                            CONCAT16(in_stack_fffffffffffffae6,
                                     CONCAT24(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)))
                   ,(gpt_params *)
                    CONCAT17(in_stack_fffffffffffffadf,
                             CONCAT16(in_stack_fffffffffffffade,
                                      CONCAT15(in_stack_fffffffffffffadd,
                                               CONCAT14(in_stack_fffffffffffffadc,
                                                        in_stack_fffffffffffffad8)))));
      iVar11 = std::__cxx11::stoi((string *)in_stack_fffffffffffffaa0,
                                  (size_t *)in_stack_fffffffffffffa98,0);
      *local_18 = iVar11;
      std::__cxx11::string::~string(local_78);
LAB_001261a7:
      local_464 = 0;
    }
    else {
      uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
      if (((bool)uVar2) ||
         (uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98),
         (bool)uVar3)) {
        get_next_arg((int *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     in_stack_fffffffffffffaf4,
                     (char **)CONCAT17(in_stack_fffffffffffffaef,
                                       CONCAT16(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8))),
                     (string *)
                     CONCAT17(in_stack_fffffffffffffae7,
                              CONCAT16(in_stack_fffffffffffffae6,
                                       CONCAT24(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                                      )),
                     (gpt_params *)
                     CONCAT17(in_stack_fffffffffffffadf,
                              CONCAT16(in_stack_fffffffffffffade,
                                       CONCAT15(in_stack_fffffffffffffadd,
                                                CONCAT14(in_stack_fffffffffffffadc,
                                                         in_stack_fffffffffffffad8)))));
        in_stack_fffffffffffffb28 =
             std::__cxx11::stoi((string *)in_stack_fffffffffffffaa0,
                                (size_t *)in_stack_fffffffffffffa98,0);
        local_18[1] = in_stack_fffffffffffffb28;
        std::__cxx11::string::~string(local_98);
        goto LAB_001261a7;
      }
      uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
      if (((bool)uVar4) ||
         (uVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98),
         (bool)uVar5)) {
        get_next_arg((int *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     in_stack_fffffffffffffaf4,
                     (char **)CONCAT17(in_stack_fffffffffffffaef,
                                       CONCAT16(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8))),
                     (string *)
                     CONCAT17(in_stack_fffffffffffffae7,
                              CONCAT16(in_stack_fffffffffffffae6,
                                       CONCAT24(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                                      )),
                     (gpt_params *)
                     CONCAT17(in_stack_fffffffffffffadf,
                              CONCAT16(in_stack_fffffffffffffade,
                                       CONCAT15(in_stack_fffffffffffffadd,
                                                CONCAT14(in_stack_fffffffffffffadc,
                                                         in_stack_fffffffffffffad8)))));
        std::__cxx11::string::operator=((string *)(local_18 + 0x16),local_b8);
        std::__cxx11::string::~string(local_b8);
        goto LAB_001261a7;
      }
      uVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
      if (((bool)uVar6) ||
         (uVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98),
         (bool)uVar7)) {
        get_next_arg((int *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     in_stack_fffffffffffffaf4,
                     (char **)CONCAT17(in_stack_fffffffffffffaef,
                                       CONCAT16(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8))),
                     (string *)
                     CONCAT17(in_stack_fffffffffffffae7,
                              CONCAT16(in_stack_fffffffffffffae6,
                                       CONCAT24(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                                      )),
                     (gpt_params *)
                     CONCAT17(in_stack_fffffffffffffadf,
                              CONCAT16(in_stack_fffffffffffffade,
                                       CONCAT15(in_stack_fffffffffffffadd,
                                                CONCAT14(in_stack_fffffffffffffadc,
                                                         in_stack_fffffffffffffad8)))));
        in_stack_fffffffffffffb20 =
             std::__cxx11::stoi((string *)in_stack_fffffffffffffaa0,
                                (size_t *)in_stack_fffffffffffffa98,0);
        local_18[2] = in_stack_fffffffffffffb20;
        std::__cxx11::string::~string(local_d8);
        goto LAB_001261a7;
      }
      uVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
      if (((bool)uVar8) ||
         (uVar9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98),
         (bool)uVar9)) {
        get_next_arg((int *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     in_stack_fffffffffffffaf4,
                     (char **)CONCAT17(in_stack_fffffffffffffaef,
                                       CONCAT16(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8))),
                     (string *)
                     CONCAT17(in_stack_fffffffffffffae7,
                              CONCAT16(in_stack_fffffffffffffae6,
                                       CONCAT24(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                                      )),
                     (gpt_params *)
                     CONCAT17(in_stack_fffffffffffffadf,
                              CONCAT16(in_stack_fffffffffffffade,
                                       CONCAT15(in_stack_fffffffffffffadd,
                                                CONCAT14(in_stack_fffffffffffffadc,
                                                         in_stack_fffffffffffffad8)))));
        in_stack_fffffffffffffb18 =
             std::__cxx11::stoi((string *)in_stack_fffffffffffffaa0,
                                (size_t *)in_stack_fffffffffffffa98,0);
        local_18[3] = in_stack_fffffffffffffb18;
        std::__cxx11::string::~string(local_f8);
        goto LAB_001261a7;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
      in_stack_fffffffffffffb14 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb14);
      if (bVar1) {
        get_next_arg((int *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     in_stack_fffffffffffffaf4,
                     (char **)CONCAT17(in_stack_fffffffffffffaef,
                                       CONCAT16(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8))),
                     (string *)
                     CONCAT17(in_stack_fffffffffffffae7,
                              CONCAT16(in_stack_fffffffffffffae6,
                                       CONCAT24(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                                      )),
                     (gpt_params *)
                     CONCAT17(in_stack_fffffffffffffadf,
                              CONCAT16(in_stack_fffffffffffffade,
                                       CONCAT15(in_stack_fffffffffffffadd,
                                                CONCAT14(in_stack_fffffffffffffadc,
                                                         in_stack_fffffffffffffad8)))));
        in_stack_fffffffffffffb10 =
             std::__cxx11::stoi((string *)in_stack_fffffffffffffaa0,
                                (size_t *)in_stack_fffffffffffffa98,0);
        local_18[8] = in_stack_fffffffffffffb10;
        std::__cxx11::string::~string(local_118);
        goto LAB_001261a7;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
      in_stack_fffffffffffffb0c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb0c);
      if (bVar1) {
        get_next_arg((int *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     in_stack_fffffffffffffaf4,
                     (char **)CONCAT17(in_stack_fffffffffffffaef,
                                       CONCAT16(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8))),
                     (string *)
                     CONCAT17(in_stack_fffffffffffffae7,
                              CONCAT16(in_stack_fffffffffffffae6,
                                       CONCAT24(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                                      )),
                     (gpt_params *)
                     CONCAT17(in_stack_fffffffffffffadf,
                              CONCAT16(in_stack_fffffffffffffade,
                                       CONCAT15(in_stack_fffffffffffffadd,
                                                CONCAT14(in_stack_fffffffffffffadc,
                                                         in_stack_fffffffffffffad8)))));
        in_stack_fffffffffffffb08 =
             std::__cxx11::stof((string *)in_stack_fffffffffffffaa0,
                                (size_t *)in_stack_fffffffffffffa98);
        local_18[9] = (int)in_stack_fffffffffffffb08;
        std::__cxx11::string::~string(local_138);
        goto LAB_001261a7;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
      if (bVar1) {
        get_next_arg((int *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     in_stack_fffffffffffffaf4,
                     (char **)CONCAT17(in_stack_fffffffffffffaef,
                                       CONCAT16(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8))),
                     (string *)
                     CONCAT17(in_stack_fffffffffffffae7,
                              CONCAT16(in_stack_fffffffffffffae6,
                                       CONCAT24(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                                      )),
                     (gpt_params *)
                     CONCAT17(in_stack_fffffffffffffadf,
                              CONCAT16(in_stack_fffffffffffffade,
                                       CONCAT15(in_stack_fffffffffffffadd,
                                                CONCAT14(in_stack_fffffffffffffadc,
                                                         in_stack_fffffffffffffad8)))));
        fVar14 = std::__cxx11::stof((string *)in_stack_fffffffffffffaa0,
                                    (size_t *)in_stack_fffffffffffffa98);
        local_18[10] = (int)fVar14;
        std::__cxx11::string::~string(local_158);
        goto LAB_001261a7;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
      in_stack_fffffffffffffafc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffafc);
      if (bVar1) {
        get_next_arg((int *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     in_stack_fffffffffffffaf4,
                     (char **)CONCAT17(in_stack_fffffffffffffaef,
                                       CONCAT16(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8))),
                     (string *)
                     CONCAT17(in_stack_fffffffffffffae7,
                              CONCAT16(in_stack_fffffffffffffae6,
                                       CONCAT24(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                                      )),
                     (gpt_params *)
                     CONCAT17(in_stack_fffffffffffffadf,
                              CONCAT16(in_stack_fffffffffffffade,
                                       CONCAT15(in_stack_fffffffffffffadd,
                                                CONCAT14(in_stack_fffffffffffffadc,
                                                         in_stack_fffffffffffffad8)))));
        in_stack_fffffffffffffaf8 =
             std::__cxx11::stoi((string *)in_stack_fffffffffffffaa0,
                                (size_t *)in_stack_fffffffffffffa98,0);
        local_18[0xb] = in_stack_fffffffffffffaf8;
        std::__cxx11::string::~string(local_178);
        goto LAB_001261a7;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
      in_stack_fffffffffffffaf4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffaf4);
      if (bVar1) {
        get_next_arg((int *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     in_stack_fffffffffffffaf4,
                     (char **)CONCAT17(in_stack_fffffffffffffaef,
                                       CONCAT16(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8))),
                     (string *)
                     CONCAT17(in_stack_fffffffffffffae7,
                              CONCAT16(in_stack_fffffffffffffae6,
                                       CONCAT24(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                                      )),
                     (gpt_params *)
                     CONCAT17(in_stack_fffffffffffffadf,
                              CONCAT16(in_stack_fffffffffffffade,
                                       CONCAT15(in_stack_fffffffffffffadd,
                                                CONCAT14(in_stack_fffffffffffffadc,
                                                         in_stack_fffffffffffffad8)))));
        fVar14 = std::__cxx11::stof((string *)in_stack_fffffffffffffaa0,
                                    (size_t *)in_stack_fffffffffffffa98);
        local_18[0xc] = (int)fVar14;
        std::__cxx11::string::~string(local_198);
        goto LAB_001261a7;
      }
      in_stack_fffffffffffffaef =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
      if (((bool)in_stack_fffffffffffffaef) ||
         (in_stack_fffffffffffffaee =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98),
         (bool)in_stack_fffffffffffffaee)) {
        get_next_arg((int *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     in_stack_fffffffffffffaf4,
                     (char **)CONCAT17(in_stack_fffffffffffffaef,
                                       CONCAT16(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8))),
                     (string *)
                     CONCAT17(in_stack_fffffffffffffae7,
                              CONCAT16(in_stack_fffffffffffffae6,
                                       CONCAT24(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                                      )),
                     (gpt_params *)
                     CONCAT17(in_stack_fffffffffffffadf,
                              CONCAT16(in_stack_fffffffffffffade,
                                       CONCAT15(in_stack_fffffffffffffadd,
                                                CONCAT14(in_stack_fffffffffffffadc,
                                                         in_stack_fffffffffffffad8)))));
        in_stack_fffffffffffffae8 =
             std::__cxx11::stoi((string *)in_stack_fffffffffffffaa0,
                                (size_t *)in_stack_fffffffffffffa98,0);
        local_18[4] = in_stack_fffffffffffffae8;
        std::__cxx11::string::~string(local_1b8);
        goto LAB_001261a7;
      }
      in_stack_fffffffffffffae7 =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
      if (((bool)in_stack_fffffffffffffae7) ||
         (in_stack_fffffffffffffae6 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98),
         (bool)in_stack_fffffffffffffae6)) {
        get_next_arg((int *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     in_stack_fffffffffffffaf4,
                     (char **)CONCAT17(in_stack_fffffffffffffaef,
                                       CONCAT16(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8))),
                     (string *)
                     CONCAT17(in_stack_fffffffffffffae7,
                              CONCAT16(in_stack_fffffffffffffae6,
                                       CONCAT24(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                                      )),
                     (gpt_params *)
                     CONCAT17(in_stack_fffffffffffffadf,
                              CONCAT16(in_stack_fffffffffffffade,
                                       CONCAT15(in_stack_fffffffffffffadd,
                                                CONCAT14(in_stack_fffffffffffffadc,
                                                         in_stack_fffffffffffffad8)))));
        in_stack_fffffffffffffae0 =
             std::__cxx11::stoi((string *)in_stack_fffffffffffffaa0,
                                (size_t *)in_stack_fffffffffffffa98,0);
        local_18[5] = in_stack_fffffffffffffae0;
        std::__cxx11::string::~string(local_1d8);
        goto LAB_001261a7;
      }
      in_stack_fffffffffffffadf =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
      if ((((bool)in_stack_fffffffffffffadf) ||
          (in_stack_fffffffffffffade =
                std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98),
          (bool)in_stack_fffffffffffffade)) ||
         (in_stack_fffffffffffffadd =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98),
         (bool)in_stack_fffffffffffffadd)) {
        get_next_arg((int *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     in_stack_fffffffffffffaf4,
                     (char **)CONCAT17(in_stack_fffffffffffffaef,
                                       CONCAT16(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8))),
                     (string *)
                     CONCAT17(in_stack_fffffffffffffae7,
                              CONCAT16(in_stack_fffffffffffffae6,
                                       CONCAT24(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                                      )),
                     (gpt_params *)
                     CONCAT17(in_stack_fffffffffffffadf,
                              CONCAT16(in_stack_fffffffffffffade,
                                       CONCAT15(in_stack_fffffffffffffadd,
                                                CONCAT14(in_stack_fffffffffffffadc,
                                                         in_stack_fffffffffffffad8)))));
        in_stack_fffffffffffffad8 =
             std::__cxx11::stoi((string *)in_stack_fffffffffffffaa0,
                                (size_t *)in_stack_fffffffffffffa98,0);
        local_18[6] = in_stack_fffffffffffffad8;
        std::__cxx11::string::~string(local_1f8);
        goto LAB_001261a7;
      }
      in_stack_fffffffffffffad7 =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
      if ((bool)in_stack_fffffffffffffad7) {
        *(undefined1 *)(local_18 + 7) = 1;
        goto LAB_001261a7;
      }
      in_stack_fffffffffffffad6 =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
      if (((bool)in_stack_fffffffffffffad6) ||
         (in_stack_fffffffffffffad5 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98),
         (bool)in_stack_fffffffffffffad5)) {
        get_next_arg((int *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     in_stack_fffffffffffffaf4,
                     (char **)CONCAT17(in_stack_fffffffffffffaef,
                                       CONCAT16(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8))),
                     (string *)
                     CONCAT17(in_stack_fffffffffffffae7,
                              CONCAT16(in_stack_fffffffffffffae6,
                                       CONCAT24(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                                      )),
                     (gpt_params *)
                     CONCAT17(in_stack_fffffffffffffadf,
                              CONCAT16(in_stack_fffffffffffffade,
                                       CONCAT15(in_stack_fffffffffffffadd,
                                                CONCAT14(in_stack_fffffffffffffadc,
                                                         in_stack_fffffffffffffad8)))));
        std::__cxx11::string::operator=((string *)(local_18 + 0xe),local_218);
        std::__cxx11::string::~string(local_218);
        goto LAB_001261a7;
      }
      in_stack_fffffffffffffad4 =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
      if (((bool)in_stack_fffffffffffffad4) ||
         (in_stack_fffffffffffffad3 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98),
         (bool)in_stack_fffffffffffffad3)) {
        *(undefined1 *)(local_18 + 0x26) = 1;
        goto LAB_001261a7;
      }
      in_stack_fffffffffffffad2 =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
      if (((bool)in_stack_fffffffffffffad2) ||
         (in_stack_fffffffffffffad1 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98),
         (bool)in_stack_fffffffffffffad1)) {
        *(undefined1 *)(local_18 + 0x26) = 1;
        get_next_arg((int *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     in_stack_fffffffffffffaf4,
                     (char **)CONCAT17(in_stack_fffffffffffffaef,
                                       CONCAT16(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8))),
                     (string *)
                     CONCAT17(in_stack_fffffffffffffae7,
                              CONCAT16(in_stack_fffffffffffffae6,
                                       CONCAT24(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                                      )),
                     (gpt_params *)
                     CONCAT17(in_stack_fffffffffffffadf,
                              CONCAT16(in_stack_fffffffffffffade,
                                       CONCAT15(in_stack_fffffffffffffadd,
                                                CONCAT14(in_stack_fffffffffffffadc,
                                                         in_stack_fffffffffffffad8)))));
        iVar11 = std::__cxx11::stoi((string *)in_stack_fffffffffffffaa0,
                                    (size_t *)in_stack_fffffffffffffa98,0);
        local_18[0x27] = iVar11;
        std::__cxx11::string::~string(local_238);
        goto LAB_001261a7;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98),
         bVar1)) {
        gpt_print_usage((int)((ulong)in_stack_fffffffffffffab0.container >> 0x20),
                        (char **)CONCAT17(in_stack_fffffffffffffaaf,
                                          CONCAT16(in_stack_fffffffffffffaae,
                                                   in_stack_fffffffffffffaa8)),
                        in_stack_fffffffffffffaa0);
        exit(0);
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
      if ((!bVar1) &&
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98),
         !bVar1)) {
        in_stack_fffffffffffffaaf =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
        if ((!(bool)in_stack_fffffffffffffaaf) &&
           (in_stack_fffffffffffffaae =
                 std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98),
           !(bool)in_stack_fffffffffffffaae)) {
          __stream = _stderr;
          uVar13 = std::__cxx11::string::c_str();
          iVar11 = (int)((ulong)in_stack_fffffffffffffab0.container >> 0x20);
          fprintf(__stream,"error: unknown argument: %s\n",uVar13);
          gpt_print_usage(iVar11,(char **)CONCAT17(in_stack_fffffffffffffaaf,
                                                   CONCAT16(in_stack_fffffffffffffaae,
                                                            in_stack_fffffffffffffaa8)),
                          (gpt_params *)__stream);
          exit(0);
        }
        get_next_arg((int *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                     in_stack_fffffffffffffaf4,
                     (char **)CONCAT17(in_stack_fffffffffffffaef,
                                       CONCAT16(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         in_stack_fffffffffffffae8))),
                     (string *)
                     CONCAT17(in_stack_fffffffffffffae7,
                              CONCAT16(in_stack_fffffffffffffae6,
                                       CONCAT24(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)
                                      )),
                     (gpt_params *)
                     CONCAT17(in_stack_fffffffffffffadf,
                              CONCAT16(in_stack_fffffffffffffade,
                                       CONCAT15(in_stack_fffffffffffffadd,
                                                CONCAT14(in_stack_fffffffffffffadc,
                                                         in_stack_fffffffffffffad8)))));
        std::__cxx11::string::operator=((string *)(local_18 + 0x1e),local_4b8);
        std::__cxx11::string::~string(local_4b8);
        goto LAB_001261a7;
      }
      get_next_arg((int *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                   in_stack_fffffffffffffaf4,
                   (char **)CONCAT17(in_stack_fffffffffffffaef,
                                     CONCAT16(in_stack_fffffffffffffaee,
                                              CONCAT24(in_stack_fffffffffffffaec,
                                                       in_stack_fffffffffffffae8))),
                   (string *)
                   CONCAT17(in_stack_fffffffffffffae7,
                            CONCAT16(in_stack_fffffffffffffae6,
                                     CONCAT24(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0)))
                   ,(gpt_params *)
                    CONCAT17(in_stack_fffffffffffffadf,
                             CONCAT16(in_stack_fffffffffffffade,
                                      CONCAT15(in_stack_fffffffffffffadd,
                                               CONCAT14(in_stack_fffffffffffffadc,
                                                        in_stack_fffffffffffffad8)))));
      std::__cxx11::string::~string(local_258);
      std::ifstream::ifstream(local_460,*(char **)(local_10 + (long)local_1c * 8),_S_in);
      bVar10 = std::ios::operator!((ios *)((long)local_460 + *(long *)(local_460[0] + -0x18)));
      if ((bVar10 & 1) == 0) {
        std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                  ((istreambuf_iterator<char,_std::char_traits<char>_> *)
                   in_stack_fffffffffffffab0.container,
                   (istream_type *)
                   CONCAT17(in_stack_fffffffffffffaaf,
                            CONCAT16(in_stack_fffffffffffffaae,in_stack_fffffffffffffaa8)));
        std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                  ((istreambuf_iterator<char,_std::char_traits<char>_> *)in_stack_fffffffffffffaa0);
        local_490 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::back_inserter<std::__cxx11::string>(in_stack_fffffffffffffa98);
        __first._M_sbuf._4_1_ = uVar7;
        __first._M_sbuf._0_4_ = in_stack_fffffffffffffb20;
        __first._M_sbuf._5_1_ = uVar6;
        __first._M_sbuf._6_1_ = uVar5;
        __first._M_sbuf._7_1_ = uVar4;
        __first._M_c = in_stack_fffffffffffffb28;
        __first._12_2_ = in_stack_fffffffffffffb2c;
        __first._14_1_ = uVar3;
        __first._15_1_ = uVar2;
        __last._M_sbuf._4_4_ = in_stack_fffffffffffffb14;
        __last._M_sbuf._0_4_ = in_stack_fffffffffffffb10;
        __last._M_c = in_stack_fffffffffffffb18;
        __last._12_2_ = in_stack_fffffffffffffb1c;
        __last._14_1_ = uVar9;
        __last._15_1_ = uVar8;
        __result.container._4_4_ = in_stack_fffffffffffffb0c;
        __result.container._0_4_ = in_stack_fffffffffffffb08;
        in_stack_fffffffffffffab0 =
             std::
             copy<std::istreambuf_iterator<char,std::char_traits<char>>,std::back_insert_iterator<std::__cxx11::string>>
                       (__first,__last,__result);
        local_498 = in_stack_fffffffffffffab0.container;
        pcVar12 = (char *)std::__cxx11::string::back();
        if (*pcVar12 == '\n') {
          std::__cxx11::string::pop_back();
        }
        local_464 = 0;
      }
      else {
        fprintf(_stderr,"error: failed to open file \'%s\'\n",
                *(undefined8 *)(local_10 + (long)local_1c * 8));
        local_464 = 2;
      }
      std::ifstream::~ifstream(local_460);
      if (local_464 == 0) goto LAB_001261a7;
    }
    std::__cxx11::string::~string(local_40);
    if (local_464 != 0) {
      return true;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool gpt_params_parse(int argc, char ** argv, gpt_params & params) {
    for (int i = 1; i < argc; i++) {
        std::string arg = argv[i];

        if (arg == "-s" || arg == "--seed") {
            params.seed = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-t" || arg == "--threads") {
            params.n_threads = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-p" || arg == "--prompt") {
            params.prompt = get_next_arg(i, argc, argv, arg, params);
        } else if (arg == "-n" || arg == "--n_predict") {
            params.n_predict = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-np" || arg == "--n_parallel") {
            params.n_parallel = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--top_k") {
            params.top_k = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--top_p") {
            params.top_p = std::stof(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--temp") {
            params.temp = std::stof(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--repeat-last-n") {
            params.repeat_last_n = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--repeat-penalty") {
            params.repeat_penalty = std::stof(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-b" || arg == "--batch_size") {
            params.n_batch= std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-c" || arg == "--context") {
            params.n_ctx= std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-ngl" || arg == "--gpu-layers" || arg == "--n-gpu-layers") {
            params.n_gpu_layers = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--ignore-eos") {
            params.ignore_eos = true;
        } else if (arg == "-m" || arg == "--model") {
            params.model = get_next_arg(i, argc, argv, arg, params);
        } else if (arg == "-i" || arg == "--interactive") {
            params.interactive = true;
        } else if (arg == "-ip" || arg == "--interactive-port") {
            params.interactive = true;
            params.interactive_port = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-h" || arg == "--help") {
            gpt_print_usage(argc, argv, params);
            exit(0);
        } else if (arg == "-f" || arg == "--file") {
            get_next_arg(i, argc, argv, arg, params);
            std::ifstream file(argv[i]);
            if (!file) {
                fprintf(stderr, "error: failed to open file '%s'\n", argv[i]);
                break;
            }
            std::copy(std::istreambuf_iterator<char>(file), std::istreambuf_iterator<char>(), back_inserter(params.prompt));
            if (params.prompt.back() == '\n') {
                params.prompt.pop_back();
            }
        } else if (arg == "-tt" || arg == "--token_test") {
            params.token_test = get_next_arg(i, argc, argv, arg, params);
        }
        else {
            fprintf(stderr, "error: unknown argument: %s\n", arg.c_str());
            gpt_print_usage(argc, argv, params);
            exit(0);
        }
    }

    return true;
}